

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Fd.cpp
# Opt level: O2

uint64_t __thiscall w3Fd::get_file_size(w3Fd *this,PCSTR file_name)

{
  int iVar1;
  stat64 st;
  string local_c8;
  stat64 local_a8;
  
  memset(&local_a8,0,0x90);
  iVar1 = fstat64(this->fd,&local_a8);
  if (iVar1 != 0) {
    StringFormat_abi_cxx11_(&local_c8,"fstat (%s)",file_name);
    ThrowErrno(local_c8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return local_a8.st_size;
}

Assistant:

uint64_t w3Fd::get_file_size (PCSTR file_name)
{
#if __CYGWIN__
    struct stat st = { 0 }; // TODO test more systems
    if (fstat (fd, &st))
#else
    struct stat64 st = { 0 }; // TODO test more systems
    if (fstat64 (fd, &st))
#endif
        ThrowErrno (StringFormat ("fstat (%s)", file_name).c_str ());
    return st.st_size;
}